

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

void glfwSetCursorPos(GLFWwindow *handle,double xpos,double ypos)

{
  _GLFWwindow *window;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if (_glfw.focusedWindow != (_GLFWwindow *)handle) {
    return;
  }
  if (*(int *)(handle + 0x58) == 0x34003) {
    *(double *)(handle + 0x48) = xpos;
    *(double *)(handle + 0x50) = ypos;
    return;
  }
  *(ulong *)(handle + 0x2a8) = CONCAT44((int)ypos,(int)xpos);
  XWarpPointer(_glfw.x11.display,0,*(undefined8 *)(handle + 0x270),0,0,0,0,(int)xpos,(int)ypos);
  return;
}

Assistant:

GLFWAPI void glfwSetCursorPos(GLFWwindow* handle, double xpos, double ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT();

    if (_glfw.focusedWindow != window)
        return;

    if (window->cursorMode == GLFW_CURSOR_DISABLED)
    {
        // Only update the accumulated position if the cursor is disabled
        window->cursorPosX = xpos;
        window->cursorPosY = ypos;
    }
    else
    {
        // Update system cursor position
        _glfwPlatformSetCursorPos(window, xpos, ypos);
    }
}